

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::ErrorTest_ErrorComparison_DefaultErrorEqualToErrorNone_Test::TestBody
          (ErrorTest_ErrorComparison_DefaultErrorEqualToErrorNone_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_70;
  Message local_68 [3];
  ErrorCode local_4c;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  Error error;
  ErrorTest_ErrorComparison_DefaultErrorEqualToErrorNone_Test *this_local;
  
  Error::Error((Error *)&gtest_ar.message_);
  local_4c = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_48,"error","ErrorCode::kNone",(Error *)&gtest_ar.message_,&local_4c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(local_68);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/error_test.cpp"
               ,99,message);
    testing::internal::AssertHelper::operator=(&local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  Error::~Error((Error *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(ErrorTest, ErrorComparison_DefaultErrorEqualToErrorNone)
{
    Error error;

    EXPECT_EQ(error, ErrorCode::kNone);
}